

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall cmExtraKateGenerator::Generate(cmExtraKateGenerator *this)

{
  cmMakefile *this_00;
  bool bVar1;
  LocalGeneratorVector *this_01;
  pointer pcVar2;
  string *type;
  string *path;
  type pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  allocator<char> local_81;
  string local_80;
  string local_60;
  string local_40;
  cmMakefile *local_20;
  cmMakefile *mf;
  value_type *lg;
  cmExtraKateGenerator *this_local;
  
  lg = (value_type *)this;
  this_01 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  mf = (cmMakefile *)
       std::
       vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
       ::operator[](this_01,0);
  pcVar2 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                     ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)mf);
  local_20 = cmLocalGenerator::GetMakefile(pcVar2);
  pcVar2 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                     ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)mf);
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_60,pcVar2);
  this_00 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_BUILD_TYPE",&local_81);
  type = cmMakefile::GetSafeDefinition(this_00,&local_80);
  pcVar2 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                     ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)mf);
  path = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar2);
  GetPathBasename(&local_b8,this,path);
  GenerateProjectName(&local_40,this,&local_60,type,&local_b8);
  std::__cxx11::string::operator=((string *)&this->ProjectName,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_60);
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            ();
  bVar1 = std::operator==(&local_d8,"Ninja");
  this->UseNinja = bVar1;
  std::__cxx11::string::~string((string *)&local_d8);
  pcVar3 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator*
                     ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)mf);
  CreateKateProjectFile(this,pcVar3);
  pcVar3 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator*
                     ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)mf);
  CreateDummyKateProjectFile(this,pcVar3);
  return;
}

Assistant:

void cmExtraKateGenerator::Generate()
{
  const auto& lg = this->GlobalGenerator->GetLocalGenerators()[0];
  const cmMakefile* mf = lg->GetMakefile();
  this->ProjectName = this->GenerateProjectName(
    lg->GetProjectName(), mf->GetSafeDefinition("CMAKE_BUILD_TYPE"),
    this->GetPathBasename(lg->GetBinaryDirectory()));
  this->UseNinja = (this->GlobalGenerator->GetName() == "Ninja");

  this->CreateKateProjectFile(*lg);
  this->CreateDummyKateProjectFile(*lg);
}